

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkStartNameIds(Abc_Ntk_t *p)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  void **ppvVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  FILE *__stream;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  char pFileName [1000];
  char acStack_418 [1000];
  
  if (p->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2a9,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2aa,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  pcVar7 = p->pSpec;
  sVar6 = strlen(pcVar7);
  if (999 < sVar6) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2ab,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  pcVar7 = Extra_FileNameGenericAppend(pcVar7,"");
  pcVar8 = Extra_FileNameExtension(p->pSpec);
  piVar10 = (int *)0x0;
  sprintf(acStack_418,"%s_%s_names.txt",pcVar7,pcVar8);
  __stream = fopen(acStack_418,"wb");
  iVar13 = p->vObjs->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar12 = iVar13;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar12;
  if (iVar12 != 0) {
    piVar10 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar9->pArray = piVar10;
  pVVar9->nSize = iVar13;
  if (piVar10 != (int *)0x0) {
    memset(piVar10,0,(long)iVar13 << 2);
  }
  p->vNameIds = pVVar9;
  pVVar11 = p->vCis;
  if (pVVar11->nSize < 1) {
    iVar13 = 1;
  }
  else {
    iVar13 = 2;
    lVar14 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar14];
      plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
      pcVar7 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
      fprintf(__stream,"%s            \n",pcVar7);
      iVar12 = (int)plVar2[2];
      if (((long)iVar12 < 0) || (p->vNameIds->nSize <= iVar12)) goto LAB_0086ca2d;
      p->vNameIds->pArray[iVar12] = iVar13;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCis;
      iVar13 = iVar13 + 2;
    } while (lVar14 < pVVar11->nSize);
    iVar13 = (int)lVar14 + 1;
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      plVar2 = *(long **)(*(long *)(*(long *)(*pVVar11->pArray[lVar14] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar11->pArray[lVar14] + 0x20) * 8);
      plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      iVar12 = (int)plVar2[2];
      if (((long)iVar12 < 0) || (p->vNameIds->nSize <= iVar12)) goto LAB_0086ca4c;
      if (p->vNameIds->pArray[iVar12] == 0) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pcVar7 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
        fprintf(__stream,"%s            \n",pcVar7);
        iVar12 = (int)plVar2[2];
        if (((long)iVar12 < 0) || (p->vNameIds->nSize <= iVar12)) goto LAB_0086ca2d;
        p->vNameIds->pArray[iVar12] = iVar13 * 2;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCos;
    } while (lVar14 < pVVar11->nSize);
  }
  pVVar11 = Abc_NtkDfs(p,1);
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar14];
      iVar12 = (int)plVar2[2];
      if (((long)iVar12 < 0) || (p->vNameIds->nSize <= iVar12)) goto LAB_0086ca4c;
      if (p->vNameIds->pArray[iVar12] == 0) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pcVar7 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
        fprintf(__stream,"%s            \n",pcVar7);
        iVar12 = (int)plVar2[2];
        if (((long)iVar12 < 0) || (p->vNameIds->nSize <= iVar12)) goto LAB_0086ca2d;
        p->vNameIds->pArray[iVar12] = iVar13 * 2;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar11->nSize);
  }
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (void **)0x0;
  }
  if (pVVar11 != (Vec_Ptr_t *)0x0) {
    free(pVVar11);
  }
  fclose(__stream);
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    ppvVar4 = pVVar11->pArray;
    pVVar9 = p->vNameIds;
    lVar14 = 0;
    do {
      plVar2 = (long *)ppvVar4[lVar14];
      plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      lVar5 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
      iVar13 = *(int *)(lVar5 + 0x10);
      if (((long)iVar13 < 0) || (pVVar9->nSize <= iVar13)) {
LAB_0086ca4c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = *(uint *)(plVar2 + 2);
      if (((int)uVar1 < 0) || (pVVar9->nSize <= (int)uVar1)) {
LAB_0086ca2d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar10 = pVVar9->pArray;
      piVar10[uVar1] = piVar10[iVar13];
      iVar13 = *(int *)(lVar5 + 0x10);
      if (((long)iVar13 < 0) || (pVVar9->nSize <= iVar13)) goto LAB_0086ca2d;
      piVar10[iVar13] = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar11->nSize);
  }
  return;
}

Assistant:

void Abc_NtkStartNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, Counter = 1;
    assert( Abc_NtkIsNetlist(p) );
    assert( p->vNameIds == NULL );
    assert( strlen(p->pSpec) < 1000 );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "wb" );
    p->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(p) );
    // add inputs
    Abc_NtkForEachCi( p, pObj, i )
        fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    // add outputs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pFanin)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pFanin), 2*Counter++);
    }
    // add nodes in a topo order
    vNodes = Abc_NtkDfs( p, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    Vec_PtrFree( vNodes );
    fclose( pFile );
    // transfer driver node names to COs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pObj), Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) );
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pFanin), 0 );
    }
}